

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void FunctionalTester<long_long,_void>::Test(void)

{
  char local_a8 [8];
  char buf2 [64];
  char buf1 [64];
  TestWatcher<long_long> local_19 [8];
  TestWatcher<long_long> tw;
  
  TestWatcher<long_long>::TestWatcher(local_19);
  int2str::convert_with_zero<long_long,char*>(-0x8000000000000000,buf2 + 0x38);
  sprintf(local_a8,"%lld",0x8000000000000000);
  StrcmpAndExit(buf2 + 0x38,local_a8);
  int2str::convert_with_zero<long_long,char*>(0x7fffffffffffffff,buf2 + 0x38);
  sprintf(local_a8,"%lld",0x7fffffffffffffff);
  StrcmpAndExit(buf2 + 0x38,local_a8);
  TestWatcher<long_long>::~TestWatcher(local_19);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }